

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O3

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
::
parallelCalculateFitness<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>>
          (Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
           *this,__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                 first,
          __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
          last,UserData *data)

{
  bool bVar1;
  Gen *g_1;
  ulong uVar2;
  pointer pGVar3;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  _Var4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  blockStart;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  Chromosome<Gen,_ComputeFitness> *local_98;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_90;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_88;
  Chromosome<Gen,_ComputeFitness> *local_68;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_60;
  UserData *local_58;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar2 = ((long)last._M_current - (long)first._M_current >> 3) * -0x3333333333333333;
  if ((last._M_current != first._M_current) &&
     (_Var4._M_current = first._M_current, (long)uVar2 < (long)(ulong)*(uint *)(this + 0xf0))) {
    do {
      fVar8 = 0.0;
      for (pGVar3 = ((_Var4._M_current)->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pGVar3 != ((_Var4._M_current)->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pGVar3 = pGVar3 + 1) {
        fVar8 = fVar8 + (float)pGVar3->bit;
      }
      (_Var4._M_current)->_fitness = -fVar8;
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != last._M_current);
  }
  uVar6 = *(long *)(this + 0xe0) - *(long *)(this + 0xd8) >> 3;
  local_88.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = data;
  local_90._M_current = first._M_current;
  if (uVar6 != 1) {
    uVar7 = 1;
    local_68 = last._M_current;
    do {
      local_98 = local_90._M_current + uVar2 / uVar6;
      local_50 = (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                  *)Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                    ::calculateFitnessBlock;
      local_48 = 0;
      local_60._M_current = (Chromosome<Gen,_ComputeFitness> *)this;
      ThreadPool::
      enqueue<void(crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::*)(__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,crsGA::UserData_const*),crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>*,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,crsGA::UserData_const*&>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (offset_in_Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_to_subr
                  *)(this + 0x20),&local_50,&local_60,&local_90,(UserData **)&local_98);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_88,
                 (future<void> *)&stack0xffffffffffffffc0);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      local_90._M_current = local_98;
      bVar1 = uVar7 < uVar6 - 1;
      uVar7 = (ulong)((int)uVar7 + 1);
      first._M_current = local_98;
      last._M_current = local_68;
    } while (bVar1);
  }
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    fVar8 = 0.0;
    for (pGVar3 = ((first._M_current)->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pGVar3 != ((first._M_current)->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl
                  .super__Vector_impl_data._M_finish; pGVar3 = pGVar3 + 1) {
      fVar8 = fVar8 + (float)pGVar3->bit;
    }
    (first._M_current)->_fitness = -fVar8;
  }
  if (uVar6 != 1) {
    uVar5 = 1;
    uVar2 = 0;
    do {
      std::__basic_future<void>::wait
                (&local_88.
                  super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar2].super___basic_future<void>,
                 first._M_current);
      uVar2 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar2 < uVar6 - 1);
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_88);
  return;
}

Assistant:

void parallelCalculateFitness(Iterator first, Iterator last, const UserData *data)
    {
        auto length = std::distance(first, last);
        if (length < _minPerThread)
            calculateFitnessBlock(first, last, data);
        const auto numThreads = _threadPool.getNumThreads();
        const size_t blockSize = length / numThreads;

        std::vector<std::future<void>> futures;
        Iterator blockStart = first;
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            Iterator blockEnd = blockStart;
            std::advance(blockEnd, blockSize);
            futures.emplace_back(_threadPool.enqueue(&Population::calculateFitnessBlock, this, blockStart, blockEnd, data));
            blockStart = blockEnd;
        }
        calculateFitnessBlock(blockStart, last, data);
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            futures[i].wait();
        }
    }